

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O3

void __thiscall
module_secondary_csv_actions::heading(module_secondary_csv_actions *this,string *module)

{
  ostream *poVar1;
  
  if (s_csv_table_marker == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[Secondary]",0xb);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,s_csv_separator_abi_cxx11_._M_dataplus._M_p,
                        s_csv_separator_abi_cxx11_._M_string_length);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(module->_M_dataplus)._M_p,module->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  }
  if (s_csv_table_header != '\0') {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Module",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,s_csv_separator_abi_cxx11_._M_dataplus._M_p,
                      s_csv_separator_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Adds\n",5);
  return;
}

Assistant:

void heading( std::string const & module )
    {
        if( s_csv_table_marker )
            std::cout << "[Secondary]" << s_csv_separator << module << "\n";
        if( s_csv_table_header )
            std::cout << "Module" << s_csv_separator << "Adds\n";
    }